

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O0

void dump_history(ang_file *file)

{
  _Bool _Var1;
  size_t sVar2;
  char local_a8 [8];
  char buf [120];
  ulong local_28;
  size_t i;
  size_t max_item;
  history_info *history_list_local;
  ang_file *file_local;
  
  max_item = 0;
  history_list_local = (history_info *)file;
  sVar2 = history_get_list(player,(history_info **)&max_item);
  file_putf((ang_file *)history_list_local,"[Player history]\n");
  file_putf((ang_file *)history_list_local,"      Turn   Depth  Note\n");
  for (local_28 = 0; local_28 < sVar2; local_28 = local_28 + 1) {
    strnfmt(local_a8,0x78,"%10ld%7d\'  %s",(long)*(int *)(max_item + local_28 * 0x5c + 8),
            (ulong)(uint)(*(short *)(max_item + local_28 * 0x5c + 2) * 0x32),
            max_item + local_28 * 0x5c + 0xc);
    _Var1 = flag_has_dbg((bitflag *)(max_item + local_28 * 0x5c),2,4,"history_list_local[i].type",
                         "HIST_ARTIFACT_LOST");
    if (_Var1) {
      my_strcat(local_a8," (LOST)",0x78);
    }
    file_putf((ang_file *)history_list_local,"%s",local_a8);
    file_put((ang_file *)history_list_local,"\n");
  }
  return;
}

Assistant:

void dump_history(ang_file *file)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	size_t i;
	char buf[120];

	file_putf(file, "[Player history]\n");
	file_putf(file, "      Turn   Depth  Note\n");

	for (i = 0; i < max_item; i++) {
		strnfmt(buf, sizeof(buf), "%10ld%7d\'  %s",
				(long)history_list_local[i].turn,
				history_list_local[i].dlev * 50,
				history_list_local[i].event);

		if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
			my_strcat(buf, " (LOST)", sizeof(buf));

		file_putf(file, "%s", buf);
		file_put(file, "\n");
	}

	return;
}